

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

char * p2sc_read_line(p2sc_iofile_t *f)

{
  int iVar1;
  undefined8 *in_RDI;
  GIOStatus status;
  GError *err;
  char *line;
  gsize term;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 uVar2;
  long local_20;
  char *local_18;
  long local_10;
  undefined8 *local_8;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  local_18 = (char *)0x0;
  local_20 = 0;
  local_8 = in_RDI;
  iVar1 = g_io_channel_read_line(*in_RDI,&local_18,0,&local_10,&local_20);
  if ((local_20 != 0) && (*(long *)(local_20 + 8) != 0)) {
    g_free(local_18);
    local_18 = (char *)0x0;
    _p2sc_msg("p2sc_read_line",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0xad,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,
              "%s:%zd: error reading: %s",local_8[1],local_8[2],*(undefined8 *)(local_20 + 8));
    exit(1);
  }
  if ((iVar1 != 1) && (iVar1 != 2)) {
    g_free(local_18);
    local_18 = (char *)0x0;
    _p2sc_msg("p2sc_read_line",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0xb5,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,
              "%s:%zd: read failed with status: %d",local_8[1],local_8[2],CONCAT44(uVar2,iVar1));
    exit(1);
  }
  if ((local_18 != (char *)0x0) && ((local_18[local_10] == '\n' || (local_18[local_10] == '\r')))) {
    local_18[local_10] = '\0';
  }
  local_8[2] = local_8[2] + 1;
  return local_18;
}

Assistant:

char *p2sc_read_line(p2sc_iofile_t *f) {
    gsize term;
    char *line = NULL;
    GError *err = NULL;
    GIOStatus status = g_io_channel_read_line(f->io, &line, NULL, &term, &err);

    if (err && err->message) {
        g_free(line);
        line = NULL;
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s:%zd: error reading: %s", f->name,
                 f->lineno, err->message);
        g_error_free(err);
    }

    if (status != G_IO_STATUS_NORMAL && status != G_IO_STATUS_EOF) {
        g_free(line);
        line = NULL;
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s:%zd: read failed with status: %d",
                 f->name, f->lineno, (int) status);
    }

    if (line && (line[term] == '\n' || line[term] == '\r'))
        line[term] = 0;

    f->lineno++;

    return line;
}